

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcTendon::~IfcTendon(IfcTendon *this)

{
  IfcElement *this_00;
  void *pvVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
           super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x10) = 0x8a1430;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x90 = 0x8a1598;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x130 = 0x8a1458;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x140 = 0x8a1480;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x178 = 0x8a14a8;
  *(undefined8 *)&this[-1].field_0x1a8 = 0x8a14d0;
  this[-1].PreStress.ptr = 4.47096603527444e-317;
  this[-1].FrictionCoefficient.ptr = 4.47098579790028e-317;
  this[-1].AnchorageSlip.ptr = 4.47100556052611e-317;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x8a1570;
  pvVar1 = *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                      super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                      field_0x10;
  if ((undefined1 *)pvVar1 !=
      &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
       super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x20) {
    operator_delete(pvVar1);
  }
  this_00 = (IfcElement *)
            ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x10);
  *(undefined8 *)
   ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
           super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x10) = 0x8a1800;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x90 = 0x8a1940;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x130 = 0x8a1828;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x140 = 0x8a1850;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x178 = 0x8a1878;
  *(undefined8 *)&this[-1].field_0x1a8 = 0x8a18a0;
  this[-1].PreStress.ptr = 4.47144824334478e-317;
  this[-1].FrictionCoefficient.ptr = 4.47146800597062e-317;
  this[-1].AnchorageSlip.ptr = 4.47148776859645e-317;
  puVar2 = (undefined1 *)this[-1].MinCurvatureRadius.ptr;
  if (puVar2 != &this[-1].field_0x220) {
    operator_delete(puVar2);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__008a15c8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcTendon() : Object("IfcTendon") {}